

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::NewKey
          (TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *this,
          FString *key)

{
  char *pcVar1;
  undefined4 uVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  FString FStack_48;
  FString local_40;
  FString local_38;
  
  FString::AttachToOther(&local_38,key);
  pNVar3 = MainPosition(this,&local_38);
  FString::~FString(&local_38);
  if (pNVar3->Next != (Node *)0x1) {
    pNVar4 = GetFreePos(this);
    if (pNVar4 == (Node *)0x0) {
      Rehash(this);
      FString::AttachToOther(&local_40,key);
      pNVar3 = NewKey(this,&local_40);
      FString::~FString(&local_40);
      return pNVar3;
    }
    FString::AttachToOther(&FStack_48,&(pNVar3->Pair).Key);
    pNVar5 = MainPosition(this,&FStack_48);
    FString::~FString(&FStack_48);
    if (pNVar5 == pNVar3) {
      pNVar4->Next = pNVar3->Next;
      pNVar5 = pNVar4;
      goto LAB_0044d20f;
    }
    do {
      pNVar6 = pNVar5;
      pNVar5 = pNVar6->Next;
    } while (pNVar5 != pNVar3);
    pNVar6->Next = pNVar4;
    uVar2 = *(undefined4 *)&(pNVar3->Pair).field_0xc;
    (pNVar4->Pair).Value = (FMissingCount)(pNVar3->Pair).Value.Count;
    *(undefined4 *)&(pNVar4->Pair).field_0xc = uVar2;
    pcVar1 = (pNVar3->Pair).Key.Chars;
    pNVar4->Next = pNVar3->Next;
    (pNVar4->Pair).Key.Chars = pcVar1;
  }
  pNVar4 = pNVar3;
  pNVar5 = (Node *)0x0;
LAB_0044d20f:
  pNVar3->Next = pNVar5;
  this->NumUsed = this->NumUsed + 1;
  FString::AttachToOther(&(pNVar4->Pair).Key,key);
  return pNVar4;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}